

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

Logger * el::Loggers::reconfigureLogger(string *identity,Configurations *configurations)

{
  Logger *pLVar1;
  Configurations *configurations_local;
  string *identity_local;
  
  pLVar1 = getLogger(identity,true);
  pLVar1 = reconfigureLogger(pLVar1,configurations);
  return pLVar1;
}

Assistant:

Logger* Loggers::reconfigureLogger(const std::string& identity, const Configurations& configurations) {
  return Loggers::reconfigureLogger(Loggers::getLogger(identity), configurations);
}